

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

RegOpnd * __thiscall IRBuilderAsmJs::BuildIntConstOpnd(IRBuilderAsmJs *this,RegSlot regSlot)

{
  uint uVar1;
  code *pcVar2;
  TypedSlotInfo *pTVar3;
  bool bVar4;
  RegSlot lhs;
  uint32 uVar5;
  JITTimeFunctionBody *pJVar6;
  AsmJsJITInfo *this_00;
  undefined4 *puVar7;
  IntConstOpnd *pIVar8;
  IntConstOpnd *opnd;
  int32 value;
  uint32 srcReg;
  int *intConstTable;
  int local_2c;
  uint *local_28;
  TypedSlotInfo *info;
  Var *constTable;
  IRBuilderAsmJs *pIStack_10;
  RegSlot regSlot_local;
  IRBuilderAsmJs *this_local;
  
  constTable._4_4_ = regSlot;
  pIStack_10 = this;
  pJVar6 = Func::GetJITFunctionBody(this->m_func);
  info = (TypedSlotInfo *)JITTimeFunctionBody::GetConstTable(pJVar6);
  pJVar6 = Func::GetJITFunctionBody(this->m_func);
  this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar6);
  AsmJsJITInfo::GetTypedSlotInfo((TypedSlotInfo *)((long)&intConstTable + 4),this_00,INT32);
  local_28 = (uint *)((long)&intConstTable + 4);
  if (local_2c == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x15e,"(info.constSrcByteOffset != Js::Constants::InvalidOffset)",
                       "info.constSrcByteOffset != Js::Constants::InvalidOffset");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  uVar1 = local_28[4];
  pJVar6 = Func::GetJITFunctionBody(this->m_func);
  lhs = JITTimeFunctionBody::GetConstCount(pJVar6);
  uVar5 = UInt32Math::Mul<8u>(lhs);
  if (uVar5 <= uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x15f,
                       "(info.constSrcByteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()))"
                       ,
                       "info.constSrcByteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount())"
                      );
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pTVar3 = info;
  uVar1 = local_28[4];
  uVar5 = GetTypedRegFromRegSlot(this,constTable._4_4_,INT32);
  if ((uVar5 == 0) || (*local_28 <= uVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x162,
                       "(srcReg >= Js::FunctionBody::FirstRegSlot && srcReg < info.constCount)",
                       "srcReg >= Js::FunctionBody::FirstRegSlot && srcReg < info.constCount");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pIVar8 = IR::IntConstOpnd::New
                     ((long)*(int *)((long)&pTVar3->constCount + (ulong)uVar5 * 4 + (ulong)uVar1),
                      TyInt32,this->m_func,false);
  return (RegOpnd *)pIVar8;
}

Assistant:

IR::RegOpnd *
IRBuilderAsmJs::BuildIntConstOpnd(Js::RegSlot regSlot)
{
    Js::Var * constTable = (Js::Var*)m_func->GetJITFunctionBody()->GetConstTable();
    const WAsmJs::TypedSlotInfo& info = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetTypedSlotInfo(WAsmJs::INT32);
    Assert(info.constSrcByteOffset != Js::Constants::InvalidOffset);
    AssertOrFailFast(info.constSrcByteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()));
    int* intConstTable = reinterpret_cast<int*>(((byte*)constTable) + info.constSrcByteOffset);
    uint32 srcReg = GetTypedRegFromRegSlot(regSlot, WAsmJs::INT32);
    AssertOrFailFast(srcReg >= Js::FunctionBody::FirstRegSlot && srcReg < info.constCount);
    const int32 value = intConstTable[srcReg];
    IR::IntConstOpnd *opnd = IR::IntConstOpnd::New(value, TyInt32, m_func);

    return (IR::RegOpnd*)opnd;
}